

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O2

Result * CoreML::Result::typeMismatchError
                   (Result *__return_storage_ptr__,FeatureType *expected,FeatureType *actual,
                   string *parameterName)

{
  ostream *poVar1;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  Result(__return_storage_ptr__);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(local_1a0,"Type mismatch for \"");
  poVar1 = std::operator<<(local_1a0,(string *)parameterName);
  std::operator<<(poVar1,"\". Expected ");
  FeatureType::toString_abi_cxx11_(&local_1d0,expected);
  poVar1 = std::operator<<(local_1a0,(string *)&local_1d0);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::operator<<(local_1a0,"found ");
  FeatureType::toString_abi_cxx11_(&local_1d0,actual);
  poVar1 = std::operator<<(local_1a0,(string *)&local_1d0);
  std::operator<<(poVar1,".");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_message,(string *)&local_1d0)
  ;
  std::__cxx11::string::~string((string *)&local_1d0);
  __return_storage_ptr__->m_type = TYPE_MISMATCH;
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

Result Result::typeMismatchError(
      const FeatureType& expected,
      const FeatureType& actual,
      const std::string& parameterName) {

    Result out;
    std::stringstream ss;
    ss << "Type mismatch for \"";
    ss << parameterName <<"\". Expected ";
    ss << expected.toString() << ", ";
    ss << "found ";
    ss << actual.toString() << ".";
    out.m_message = ss.str();
    out.m_type = ResultType::TYPE_MISMATCH;
    return out;
  }